

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool __thiscall
duckdb_re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  size_type sVar10;
  byte *pbVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint *puVar15;
  byte *p;
  ulong uVar16;
  StringPiece context;
  char *matchcap [10];
  char *cap [10];
  MatchKind local_264;
  StringPiece local_258;
  ulong local_248;
  uint *local_240;
  byte *local_238;
  int local_22c;
  size_t local_228;
  StringPiece *local_220;
  uint *local_218;
  Prog *local_210;
  byte *local_208 [10];
  byte *local_1b8;
  ostringstream local_1b0 [8];
  undefined8 local_1a8 [13];
  ios_base local_140 [272];
  
  if (kind == kFullMatch || anchor == kAnchored) {
    uVar4 = nmatch * 2;
    uVar16 = 2;
    if (2 < (int)uVar4) {
      uVar16 = (ulong)uVar4;
    }
    switchD_01043a80::default(&local_1b8,0,uVar16 * 8);
    switchD_01043a80::default(local_208,0,uVar16 * 8);
    local_258.data_ = const_context->data_;
    local_258.size_ = const_context->size_;
    if ((byte *)local_258.data_ == (byte *)0x0) {
      local_258.data_ = text->data_;
      local_258.size_ = text->size_;
    }
    p = (byte *)text->data_;
    if ((this->anchor_start_ != true) || ((byte *)local_258.data_ == p)) {
      if (this->anchor_end_ == false) {
        sVar10 = text->size_;
        local_264 = kind;
      }
      else {
        sVar10 = text->size_;
        if ((byte *)(local_258.data_ + local_258.size_) != p + sVar10) {
          return false;
        }
        local_264 = kFullMatch;
      }
      puVar12 = (uint *)(this->onepass_nodes_).ptr_._M_t.
                        super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      local_208[0] = p;
      local_1b8 = p;
      puVar15 = puVar12;
      local_220 = match;
      if ((long)sVar10 < 1) {
        local_248 = 0;
      }
      else {
        local_22c = this->bytemap_range_ * 4 + 4;
        pbVar11 = p + sVar10;
        uVar13 = 3;
        if (3 < (int)uVar4) {
          uVar13 = uVar4;
        }
        local_228 = (ulong)(uVar13 - 2) << 3;
        local_248 = 0;
        uVar13 = *puVar12;
        local_240 = puVar12;
        local_238 = pbVar11;
        local_210 = this;
        do {
          uVar1 = puVar15[(ulong)local_210->bytemap_[*p] + 1];
          if (((uVar1 & 0x3f) == 0) ||
             (uVar5 = EmptyFlags(&local_258,(char *)p), pbVar11 = local_238, puVar12 = local_240,
             (uVar1 & 0x3f & ~uVar5) == 0)) {
            lVar9 = (long)(int)((uVar1 >> 0x10) * local_22c);
            puVar15 = (uint *)((long)puVar12 + lVar9);
            uVar14 = *(uint *)((long)puVar12 + lVar9);
          }
          else {
            uVar14 = 0x30;
            puVar15 = (uint *)0x0;
          }
          if ((local_264 != kFullMatch) && (uVar13 != 0x30)) {
            uVar6 = uVar14 & 0x3f | uVar1 & 0x40;
            if (uVar6 != 0) {
              if ((uVar13 & 0x3f) != 0) {
                local_218 = puVar15;
                uVar5 = EmptyFlags(&local_258,(char *)p);
                uVar6 = ~uVar5;
                pbVar11 = local_238;
                puVar12 = local_240;
                puVar15 = local_218;
                if ((uVar13 & 0x3f & uVar6) != 0) goto LAB_01ca9ac3;
              }
              pvVar7 = (void *)(ulong)uVar6;
              if ((1 < nmatch) &&
                 (pvVar7 = switchD_015de399::default(local_208 + 2,local_1a8,local_228),
                 pbVar11 = local_238, puVar12 = local_240, (uVar13 & 0x7f80) != 0)) {
                uVar8 = 2;
                do {
                  uVar6 = uVar13 >> ((byte)uVar8 & 0x1f);
                  pvVar7 = (void *)(ulong)uVar6;
                  if ((uVar6 & 0x20) != 0) {
                    local_208[uVar8] = p;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar16 != uVar8);
              }
              local_208[1] = p;
              local_248 = CONCAT71((int7)((ulong)pvVar7 >> 8),1);
              if ((local_264 == kFirstMatch) && ((uVar1 & 0x40) != 0)) goto LAB_01ca9bba;
            }
          }
LAB_01ca9ac3:
          if (puVar15 == (uint *)0x0) goto LAB_01ca9b3b;
          if ((1 < nmatch) && ((uVar1 & 0x7f80) != 0)) {
            uVar8 = 2;
            do {
              if ((uVar1 >> ((byte)uVar8 & 0x1f) & 0x20) != 0) {
                *(byte **)(local_1b0 + uVar8 * 8 + -8) = p;
              }
              uVar8 = uVar8 + 1;
            } while (uVar16 != uVar8);
          }
          p = p + 1;
          uVar13 = uVar14;
        } while (p < pbVar11);
      }
      uVar13 = *puVar15;
      if ((uVar13 == 0x30) ||
         (((uVar13 & 0x3f) != 0 &&
          (uVar5 = EmptyFlags(&local_258,(char *)p), (uVar13 & 0x3f & ~uVar5) != 0)))) {
LAB_01ca9b3b:
        if ((local_248 & 1) == 0) {
          return false;
        }
      }
      else {
        if ((1 < nmatch) && ((uVar13 & 0x7f80) != 0)) {
          uVar8 = 2;
          do {
            if ((uVar13 >> ((byte)uVar8 & 0x1f) & 0x20) != 0) {
              *(byte **)(local_1b0 + uVar8 * 8 + -8) = p;
            }
            uVar8 = uVar8 + 1;
          } while (uVar16 != uVar8);
        }
        if (1 < nmatch) {
          uVar13 = 3;
          if (3 < (int)uVar4) {
            uVar13 = uVar4;
          }
          switchD_015de399::default(local_208 + 2,local_1a8,(ulong)(uVar13 - 2) << 3);
        }
        local_208[1] = p;
      }
LAB_01ca9bba:
      if (0 < nmatch) {
        lVar9 = 0;
        do {
          lVar2 = *(long *)((long)local_208 + lVar9);
          lVar3 = *(long *)((long)local_208 + lVar9 + 8);
          *(long *)((long)&local_220->data_ + lVar9) = lVar2;
          *(long *)((long)&local_220->size_ + lVar9) = lVar3 - lVar2;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(uint)nmatch << 4 != lVar9);
        return true;
      }
      return true;
    }
  }
  else {
    local_1b8 = (byte *)((ulong)local_1b8 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"Cannot use SearchOnePass for unanchored matches.",0x30);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    std::ios_base::~ios_base(local_140);
  }
  return false;
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  if (anchor_start() && BeginPtr(context) != BeginPtr(text))
    return false;
  if (anchor_end() && EndPtr(context) != EndPtr(text))
    return false;
  if (anchor_end())
    kind = kFullMatch;

  uint8_t* nodes = onepass_nodes_.data();
  int statesize = sizeof(uint32_t) + bytemap_range()*sizeof(uint32_t);

  // start() is always mapped to the zeroth OneState.
  OneState* state = IndexToNode(nodes, statesize, 0);
  uint8_t* bytemap = bytemap_;
  const char* bp = text.data();
  const char* ep = text.data() + text.size();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32_t nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32_t matchcond = nextmatchcond;
    uint32_t cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32_t nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32_t matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i] =
        StringPiece(matchcap[2 * i],
                    static_cast<size_t>(matchcap[2 * i + 1] - matchcap[2 * i]));
  return true;
}